

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O0

void TPZTensor<TFad<6,_double>_>::TPZDecomposed::TangentCheckConv
               (TPZFMatrix<double> *state,TPZFMatrix<double> *tangent,int icase)

{
  double dVar1;
  double *pdVar2;
  ostream *this;
  void *pvVar3;
  uint in_EDX;
  long *in_RSI;
  TPZFMatrix<double> *in_RDI;
  double dVar4;
  int i_2;
  STATE sum2;
  STATE sum;
  int j;
  int i_1;
  TPZDecomposed objdec;
  int i;
  TPZTensor<double> obj;
  undefined8 in_stack_fffffffffffffbf8;
  TPZDecomposed *in_stack_fffffffffffffc00;
  TPZTensor<double> *in_stack_fffffffffffffc10;
  int64_t in_stack_fffffffffffffc18;
  TPZFMatrix<double> *in_stack_fffffffffffffc20;
  TPZTensor<double> *in_stack_fffffffffffffc48;
  TPZDecomposed *in_stack_fffffffffffffc50;
  int local_304;
  double local_2f8;
  int local_2f0;
  int local_2ec;
  TPZVec<double> local_2b0 [8];
  TPZVec<TPZTensor<double>_> local_1b0 [9];
  int local_74;
  uint local_14;
  long *local_10;
  TPZFMatrix<double> *local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  TPZTensor<double>::TPZTensor(in_stack_fffffffffffffc10);
  for (local_74 = 0; local_74 < 6; local_74 = local_74 + 1) {
    pdVar2 = TPZFMatrix<double>::operator()(local_8,(long)local_74);
    dVar4 = *pdVar2;
    pdVar2 = TPZTensor<double>::operator[]
                       ((TPZTensor<double> *)in_stack_fffffffffffffc00,
                        (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20));
    *pdVar2 = dVar4;
  }
  TPZTensor<double>::TPZDecomposed::TPZDecomposed
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  if (local_14 < 3) {
    (**(code **)(*local_10 + 0x68))(local_10,1,9);
    for (local_2ec = 0; local_2ec < 3; local_2ec = local_2ec + 1) {
      pdVar2 = TPZVec<double>::operator[](local_2b0,(long)local_2ec);
      gEigval[local_2ec] = *pdVar2;
    }
    for (local_2f0 = 0; local_2f0 < 6; local_2f0 = local_2f0 + 1) {
      TPZVec<TPZTensor<double>_>::operator[](local_1b0,(long)(int)local_14);
      pdVar2 = TPZTensor<double>::operator[]
                         ((TPZTensor<double> *)in_stack_fffffffffffffc00,
                          (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20));
      dVar4 = *pdVar2;
      pdVar2 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                          (int64_t)in_stack_fffffffffffffc10);
      *pdVar2 = dVar4;
      TPZVec<TPZTensor<double>_>::operator[](local_1b0,(long)(int)local_14);
      pdVar2 = TPZTensor<double>::XY((TPZTensor<double> *)0x14b166c);
      dVar4 = *pdVar2;
      pdVar2 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                          (int64_t)in_stack_fffffffffffffc10);
      *pdVar2 = dVar4;
      TPZVec<TPZTensor<double>_>::operator[](local_1b0,(long)(int)local_14);
      pdVar2 = TPZTensor<double>::XZ((TPZTensor<double> *)0x14b16ec);
      dVar4 = *pdVar2;
      pdVar2 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                          (int64_t)in_stack_fffffffffffffc10);
      *pdVar2 = dVar4;
      TPZVec<TPZTensor<double>_>::operator[](local_1b0,(long)(int)local_14);
      pdVar2 = TPZTensor<double>::YZ((TPZTensor<double> *)0x14b1766);
      dVar4 = *pdVar2;
      pdVar2 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                          (int64_t)in_stack_fffffffffffffc10);
      *pdVar2 = dVar4;
    }
    local_2f8 = 0.0;
    for (local_304 = 0; local_304 < 9; local_304 = local_304 + 1) {
      pdVar2 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                          (int64_t)in_stack_fffffffffffffc10);
      dVar4 = *pdVar2;
      pdVar2 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                          (int64_t)in_stack_fffffffffffffc10);
      local_2f8 = dVar4 * *pdVar2 + local_2f8;
    }
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                        (int64_t)in_stack_fffffffffffffc10);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
                        (int64_t)in_stack_fffffffffffffc10);
    dVar4 = dVar4 + *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()
                       (in_stack_fffffffffffffc20,(int64_t)dVar4,(int64_t)in_stack_fffffffffffffc10)
    ;
    dVar1 = *pdVar2;
    (**(code **)(*local_10 + 0xe0))(local_10,"tangent",&std::cout,0);
    this = std::operator<<((ostream *)&std::cout,"sum2 = ");
    pvVar3 = (void *)std::ostream::operator<<(this,dVar4 + dVar1);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    in_stack_fffffffffffffc00 = (TPZDecomposed *)std::operator<<((ostream *)&std::cout,"sum = ");
    pvVar3 = (void *)std::ostream::operator<<(in_stack_fffffffffffffc00,local_2f8);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  TPZTensor<double>::TPZDecomposed::~TPZDecomposed(in_stack_fffffffffffffc00);
  TPZTensor<double>::~TPZTensor((TPZTensor<double> *)0x14b19e6);
  return;
}

Assistant:

static void TangentCheckConv(TPZFMatrix<STATE> &state, TPZFMatrix<STATE> &tangent, int icase) {
            TPZTensor<STATE> obj;
            for (int i = 0; i < 6; i++) {
                obj[i] = state(i);
            }
            TPZTensor<STATE>::TPZDecomposed objdec(obj);
            switch (icase) {
                case 0:
                case 1:
                case 2:
                {
                    tangent.Resize(1, 9);
                    for (int i = 0; i < 3; i++) {
                        gEigval[i] = objdec.fEigenvalues[i];
                    }
                    for (int j = 0; j < 6; j++) {
                        tangent(0, j) = objdec.fEigentensors[icase][j];
                        tangent(0, 6) = objdec.fEigentensors[icase].XY();
                        tangent(0, 7) = objdec.fEigentensors[icase].XZ();
                        tangent(0, 8) = objdec.fEigentensors[icase].YZ();
                    }
                    STATE sum = 0., sum2 = 0.;
                    for (int i = 0; i < 9; i++) {
                        sum += tangent(0, i) * tangent(0, i);
                    }
                    sum2 = tangent(0, _XX_) + tangent(0, _YY_) + tangent(0, _ZZ_);
                    tangent.Print("tangent");
                    std::cout << "sum2 = " << sum2 << std::endl;
                    std::cout << "sum = " << sum << std::endl;
                }
                    break;
                default:
                    break;
            }
        }